

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void __thiscall cashew::JSPrinter::printBreak(JSPrinter *this,Ref node)

{
  bool bVar1;
  Ref *pRVar2;
  char *s;
  Ref local_20;
  Ref node_local;
  
  local_20.inst = node.inst;
  emit(this,"break");
  pRVar2 = Ref::operator[](&local_20,1);
  bVar1 = Ref::operator!(pRVar2);
  if (!bVar1) {
    emit(this,' ');
    pRVar2 = Ref::operator[](&local_20,1);
    s = cashew::Value::getCString(pRVar2->inst);
    emit(this,s);
  }
  return;
}

Assistant:

void printBreak(Ref node) {
    emit("break");
    if (!!node[1]) {
      emit(' ');
      emit(node[1]->getCString());
    }
  }